

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeGravityForceScale(ChElementHexaANCF_3813_9 *this)

{
  double dVar1;
  double dVar2;
  Brick9_Gravity myformula;
  ChIntegrable3D<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> local_18;
  ChElementHexaANCF_3813_9 *local_10;
  
  local_18._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5dc48;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[9] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  local_10 = this;
  ChQuadrature::Integrate3D<Eigen::Matrix<double,11,1,0,11,1>>
            (&this->m_GravForceScale,&local_18,-1.0,1.0,-1.0,1.0,-1.0,1.0,2);
  dVar1 = (((this->m_material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->super_ChContinuumMaterial).density;
  dVar2 = (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
          m_storage.m_data.array[1];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[0] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [0];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[1] = dVar1 * dVar2;
  dVar2 = (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
          m_storage.m_data.array[3];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[2] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [2];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[3] = dVar1 * dVar2;
  dVar2 = (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
          m_storage.m_data.array[5];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[4] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [4];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[5] = dVar1 * dVar2;
  dVar2 = (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
          m_storage.m_data.array[7];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[6] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [6];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[7] = dVar1 * dVar2;
  dVar2 = (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
          m_storage.m_data.array[9];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[8] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [8];
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[9] = dVar1 * dVar2;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.
  m_data.array[10] =
       dVar1 * (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [10];
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeGravityForceScale() {
    Brick9_Gravity myformula(this);

    m_GravForceScale.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 11>>(m_GravForceScale,  // result of integration will go there
                                                     myformula,         // formula to integrate
                                                     -1, 1,             // limits in x direction
                                                     -1, 1,             // limits in y direction
                                                     -1, 1,             // limits in z direction
                                                     2                  // order of integration
    );

    m_GravForceScale *= m_material->Get_density();
}